

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

wchar_t rd_artifacts(void)

{
  uint8_t *ip;
  ushort uVar1;
  ulong in_RAX;
  char *message;
  wchar_t wVar2;
  ulong uVar3;
  uint8_t tmp8u;
  uint16_t tmp16u;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  rd_u16b((uint16_t *)((long)&uStack_28 + 6));
  uVar1 = uStack_28._6_2_;
  if (player->is_dead == true) {
    uVar1 = uStack_28._6_2_ - 0x28;
    uStack_28 = CONCAT26(uVar1,(undefined6)uStack_28);
  }
  if (z_info->a_max < uVar1) {
    message = format("Too many (%u) artifacts!",(ulong)uVar1);
    note(message);
    wVar2 = L'\xffffffff';
  }
  else {
    wVar2 = L'\0';
    if (uVar1 != 0) {
      ip = (uint8_t *)((long)&uStack_28 + 5);
      uVar3 = 0;
      do {
        rd_byte(ip);
        aup_info[uVar3].created = uStack_28._5_1_ != '\0';
        rd_byte(ip);
        aup_info[uVar3].seen = uStack_28._5_1_ != '\0';
        rd_byte(ip);
        aup_info[uVar3].everseen = uStack_28._5_1_ != '\0';
        rd_byte(ip);
        uVar3 = uVar3 + 1;
        wVar2 = L'\0';
      } while (uVar3 < uStack_28 >> 0x30);
    }
  }
  return wVar2;
}

Assistant:

int rd_artifacts(void)
{
	int i;
	uint16_t tmp16u;

	/* Load the Artifacts */
	rd_u16b(&tmp16u);
	if (player->is_dead) {
		/* No randarts loaded, so less artifacts to check */
		tmp16u -= ART_NUM_RANDOM;
	}
	if (tmp16u > z_info->a_max) {
		note(format("Too many (%u) artifacts!", tmp16u));
		return (-1);
	}

	/* Read the artifact flags */
	for (i = 0; i < tmp16u; i++) {
		uint8_t tmp8u;

		rd_byte(&tmp8u);
		aup_info[i].created = tmp8u ? true : false;
		rd_byte(&tmp8u);
		aup_info[i].seen = tmp8u ? true : false;
		rd_byte(&tmp8u);
		aup_info[i].everseen = tmp8u ? true : false;
		rd_byte(&tmp8u);
	}

	return 0;
}